

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator_mq.c
# Opt level: O2

size_t validator_mq_get_buffsize(mqd_t queue,_Bool *err)

{
  int iVar1;
  undefined1 local_50 [8];
  mq_attr tmp;
  
  iVar1 = mq_getattr(queue,(mq_attr *)local_50);
  if (iVar1 == -1) {
    if (err != (_Bool *)0x0) {
      *err = true;
    }
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/validator_mq.c"
                  ,"validator_mq_get_buffsize");
    tmp.mq_maxmsg = 0xffffffffffffffff;
  }
  return tmp.mq_maxmsg;
}

Assistant:

size_t validator_mq_get_buffsize(mqd_t queue, bool *err) {
    assert(err != NULL);

    int tmp_err = 0;
    struct mq_attr tmp;

    tmp_err = mq_getattr(queue, &tmp);
    INT_FAIL_IF(tmp_err == -1);
    return (size_t) tmp.mq_msgsize;
}